

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O1

Point3<float> __thiscall
pbrt::EvaluateCubicBezier<pbrt::Point3<float>,pbrt::Vector3<float>>
          (pbrt *this,span<const_pbrt::Point3<float>_> cp,Float u,Vector3<float> *deriv)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined8 uVar9;
  bool bVar10;
  undefined8 *puVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar17 [16];
  float fVar22;
  float fVar24;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  Point3<float> PVar26;
  
  puVar11 = (undefined8 *)cp.n;
  fVar8 = 1.0 - u;
  fVar1 = *(float *)(this + 8);
  fVar5 = fVar8 * *(float *)(this + 0x14) + *(float *)(this + 0x20) * u;
  fVar2 = *(float *)(this + 0x2c);
  fVar6 = fVar8 * (fVar8 * fVar1 + *(float *)(this + 0x14) * u) + fVar5 * u;
  uVar3 = *(ulong *)this;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar3;
  fVar15 = (float)*(undefined8 *)(this + 0xc);
  fVar18 = (float)((ulong)*(undefined8 *)(this + 0xc) >> 0x20);
  fVar22 = (float)*(undefined8 *)(this + 0x18);
  fVar24 = (float)((ulong)*(undefined8 *)(this + 0x18) >> 0x20);
  fVar16 = fVar15 * fVar8 + fVar22 * u;
  fVar19 = fVar18 * fVar8 + fVar24 * u;
  fVar20 = fVar8 * 0.0 + u * 0.0;
  fVar21 = fVar8 * 0.0 + u * 0.0;
  uVar4 = *(ulong *)(this + 0x24);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar4;
  auVar14._0_4_ = (fVar8 * (float)uVar3 + fVar15 * u) * fVar8 + fVar16 * u;
  auVar14._4_4_ = (fVar8 * (float)(uVar3 >> 0x20) + fVar18 * u) * fVar8 + fVar19 * u;
  auVar14._8_4_ = (fVar8 * 0.0 + u * 0.0) * fVar8 + fVar20 * u;
  auVar14._12_4_ = (fVar8 * 0.0 + u * 0.0) * fVar8 + fVar21 * u;
  auVar17._0_4_ = fVar16 * fVar8 + (fVar22 * fVar8 + (float)uVar4 * u) * u;
  auVar17._4_4_ = fVar19 * fVar8 + (fVar24 * fVar8 + (float)(uVar4 >> 0x20) * u) * u;
  auVar17._8_4_ = fVar20 * fVar8 + (fVar8 * 0.0 + u * 0.0) * u;
  auVar17._12_4_ = fVar21 * fVar8 + (fVar8 * 0.0 + u * 0.0) * u;
  fVar5 = fVar8 * fVar5 + (fVar8 * *(float *)(this + 0x20) + fVar2 * u) * u;
  if (puVar11 != (undefined8 *)0x0) {
    auVar7 = vsubps_avx(auVar17,auVar14);
    fVar15 = fVar5 - fVar6;
    auVar25._0_4_ = auVar7._0_4_ * auVar7._0_4_;
    auVar25._4_4_ = auVar7._4_4_ * auVar7._4_4_;
    auVar25._8_4_ = auVar7._8_4_ * auVar7._8_4_;
    auVar25._12_4_ = auVar7._12_4_ * auVar7._12_4_;
    auVar12 = vmovshdup_avx(auVar25);
    auVar12 = vfmadd231ss_fma(auVar12,auVar7,auVar7);
    auVar25 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
    auVar12._8_4_ = 0x40400000;
    auVar12._0_8_ = 0x4040000040400000;
    auVar12._12_4_ = 0x40400000;
    auVar12 = vmulps_avx512vl(auVar7,auVar12);
    uVar9 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar25,1);
    bVar10 = (bool)((byte)uVar9 & 1);
    if (auVar25._0_4_ <= 0.0) {
      auVar12 = vsubps_avx(auVar23,auVar13);
    }
    uVar9 = vmovlps_avx(auVar12);
    *puVar11 = uVar9;
    *(uint *)(puVar11 + 1) =
         (uint)bVar10 * (int)(fVar15 * 3.0) + (uint)!bVar10 * (int)(fVar2 - fVar1);
  }
  PVar26.super_Tuple3<pbrt::Point3,_float>.y = auVar14._4_4_ * fVar8 + auVar17._4_4_ * u;
  PVar26.super_Tuple3<pbrt::Point3,_float>.x = auVar14._0_4_ * fVar8 + auVar17._0_4_ * u;
  PVar26.super_Tuple3<pbrt::Point3,_float>.z = fVar8 * fVar6 + fVar5 * u;
  return (Point3<float>)PVar26.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

PBRT_CPU_GPU inline P EvaluateCubicBezier(pstd::span<const P> cp, Float u, V *deriv) {
    P cp1[3] = {Lerp(u, cp[0], cp[1]), Lerp(u, cp[1], cp[2]), Lerp(u, cp[2], cp[3])};
    P cp2[2] = {Lerp(u, cp1[0], cp1[1]), Lerp(u, cp1[1], cp1[2])};
    if (deriv != nullptr) {
        if (LengthSquared(cp2[1] - cp2[0]) > 0)
            *deriv = 3 * (cp2[1] - cp2[0]);
        else {
            // For a cubic Bezier, if the first three control points (say) are
            // coincident, then the derivative of the curve is legitimately
            // (0,0,0) at u=0.  This is problematic for us, though, since we'd
            // like to be able to compute a surface normal there.  In that case,
            // just punt and take the difference between the first and last
            // control points, which ain't great, but will hopefully do.
            *deriv = cp[3] - cp[0];
        }
    }
    return Lerp(u, cp2[0], cp2[1]);
}